

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_boolean(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  uint8_t uVar1;
  int local_34;
  int b;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  if (*begin == '?') {
    if (begin + 1 == end) {
      dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
    }
    else {
      dest_local = (nghttp2_sf_value *)0x2;
      uVar1 = begin[1];
      if (uVar1 == '0') {
        local_34 = 0;
      }
      else {
        if (uVar1 != '1') {
          return -1;
        }
        local_34 = 1;
      }
      if (dest != (nghttp2_sf_value *)0x0) {
        dest->type = '\0';
        (dest->field_1).b = local_34;
      }
    }
  }
  else {
    dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
  }
  return (ssize_t)dest_local;
}

Assistant:

static ssize_t sf_parse_boolean(nghttp2_sf_value *dest, const uint8_t *begin,
                                const uint8_t *end) {
  const uint8_t *p = begin;
  int b;

  if (*p++ != '?') {
    return -1;
  }

  if (p == end) {
    return -1;
  }

  switch (*p++) {
  case '0':
    b = 0;
    break;
  case '1':
    b = 1;
    break;
  default:
    return -1;
  }

  if (dest) {
    dest->type = NGHTTP2_SF_VALUE_TYPE_BOOLEAN;
    dest->b = b;
  }

  return p - begin;
}